

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

void __thiscall QFutureInterfaceBase::suspendIfRequested(QFutureInterfaceBase *this)

{
  bool bVar1;
  int state_00;
  uint state_01;
  long in_RDI;
  long in_FS_OFFSET;
  int state;
  int state_1;
  ThreadPoolThreadReleaser releaser;
  anon_class_1_0_00000001 canSuspend;
  QMutexLocker<QMutex> lock;
  TimerType in_stack_ffffffffffffff38;
  ForeverConstant in_stack_ffffffffffffff3c;
  QFutureInterfaceBasePrivate *in_stack_ffffffffffffff40;
  QFutureCallOutEvent *in_stack_ffffffffffffff48;
  void *__stat_loc;
  QFutureInterfaceBasePrivate *in_stack_ffffffffffffff50;
  anon_class_1_0_00000001 local_19;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_19 = (anon_class_1_0_00000001)0xaa;
  state_00 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x6dcfd8);
  bVar1 = suspendIfRequested::anon_class_1_0_00000001::operator()(&local_19,state_00);
  if (bVar1) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
    QMutexLocker<QMutex>::QMutexLocker
              ((QMutexLocker<QMutex> *)in_stack_ffffffffffffff40,
               (QMutex *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    state_01 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x6dd030);
    bVar1 = suspendIfRequested::anon_class_1_0_00000001::operator()(&local_19,state_01);
    if (bVar1) {
      if ((state_01 & 0x20) == 0) {
        switch_from_to((QAtomicInt *)in_stack_ffffffffffffff48,(int)((ulong)in_RDI >> 0x20),
                       (int)in_RDI);
        QFutureCallOutEvent::QFutureCallOutEvent
                  ((QFutureCallOutEvent *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                   in_stack_ffffffffffffff38);
        QFutureInterfaceBasePrivate::sendCallOut
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        QFutureCallOutEvent::~QFutureCallOutEvent((QFutureCallOutEvent *)in_stack_ffffffffffffff40);
      }
      QFutureInterfaceBasePrivate::pool(in_stack_ffffffffffffff40);
      anon_unknown.dwarf_f2b43a::ThreadPoolThreadReleaser::ThreadPoolThreadReleaser
                ((ThreadPoolThreadReleaser *)in_stack_ffffffffffffff40,
                 (QThreadPool *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      __stat_loc = *(void **)(in_RDI + 8);
      in_stack_ffffffffffffff40 = (QFutureInterfaceBasePrivate *)((long)__stat_loc + 0x40);
      QDeadlineTimer::QDeadlineTimer
                ((QDeadlineTimer *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                 in_stack_ffffffffffffff38);
      QWaitCondition::wait((QWaitCondition *)in_stack_ffffffffffffff40,__stat_loc);
      anon_unknown.dwarf_f2b43a::ThreadPoolThreadReleaser::~ThreadPoolThreadReleaser
                ((ThreadPoolThreadReleaser *)in_stack_ffffffffffffff40);
    }
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_stack_ffffffffffffff40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFutureInterfaceBase::suspendIfRequested()
{
    const auto canSuspend = [] (int state) {
        // can suspend only if 1) in any suspend-related state; 2) not canceled
        return (state & suspendingOrSuspended) && !(state & Canceled);
    };

    // return early if possible to avoid taking the mutex lock.
    {
        const int state = d->state.loadRelaxed();
        if (!canSuspend(state))
            return;
    }

    QMutexLocker lock(&d->m_mutex);
    const int state = d->state.loadRelaxed();
    if (!canSuspend(state))
        return;

    // Note: expecting that Suspending and Suspended are mutually exclusive
    if (!(state & Suspended)) {
        // switch state in case this is the first invocation
        switch_from_to(d->state, Suspending, Suspended);
        d->sendCallOut(QFutureCallOutEvent(QFutureCallOutEvent::Suspended));
    }

    // decrease active thread count since this thread will wait.
    const ThreadPoolThreadReleaser releaser(d->pool());
    d->pausedWaitCondition.wait(&d->m_mutex);
}